

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O0

void skiwi::skiwi_show_assembly(string *input)

{
  string local_70;
  string local_50;
  undefined1 local_30 [8];
  string assembly;
  string *input_local;
  
  assembly.field_2._8_8_ = input;
  std::__cxx11::string::string((string *)&local_70,(string *)input);
  anon_unknown_1::remove_command(&local_50,&local_70);
  skiwi_assembly((string *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  (anonymous_namespace)::out<std::__cxx11::string&,char_const(&)[2]>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (char (*) [2])0x4e6c28);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void skiwi_show_assembly(const std::string& input)
  {
  std::string assembly = skiwi_assembly(remove_command(input));
  out(assembly, "\n");
  }